

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obuf.c
# Opt level: O0

size_t obuf_dup(obuf *buf,void *data,size_t size)

{
  ulong __n;
  void *pvVar1;
  size_t fill;
  size_t to_copy;
  size_t capacity;
  iovec *iov;
  size_t size_local;
  void *data_local;
  obuf *buf_local;
  
  capacity = (size_t)(buf->iov + buf->pos);
  to_copy = buf->capacity[buf->pos];
  fill = size;
  size_local = (size_t)data;
  do {
    if (*(long *)(capacity + 8) + fill <= to_copy) {
LAB_00105cef:
      memcpy((void *)(*(long *)capacity + *(long *)(capacity + 8)),(void *)size_local,fill);
      *(size_t *)(capacity + 8) = fill + *(long *)(capacity + 8);
      buf->used = fill + buf->used;
      if (*(ulong *)(capacity + 8) <= buf->capacity[buf->pos]) {
        return size;
      }
      __assert_fail("iov->iov_len <= buf->capacity[buf->pos]",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c"
                    ,0xa9,"size_t obuf_dup(struct obuf *, const void *, size_t)");
    }
    if (*(ulong *)(capacity + 8) < to_copy) {
      __n = to_copy - *(long *)(capacity + 8);
      if (fill <= __n) {
        __assert_fail("fill < to_copy",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c"
                      ,0x86,"size_t obuf_dup(struct obuf *, const void *, size_t)");
      }
      memcpy((void *)(*(long *)capacity + *(long *)(capacity + 8)),(void *)size_local,__n);
      *(ulong *)(capacity + 8) = __n + *(long *)(capacity + 8);
      buf->used = __n + buf->used;
      size_local = size_local + __n;
      fill = fill - __n;
    }
    else if (to_copy == 0) {
      pvVar1 = obuf_alloc_pos(buf,fill);
      if (pvVar1 == (void *)0x0) {
        return size - fill;
      }
      goto LAB_00105cef;
    }
    if (to_copy != *(size_t *)(capacity + 8)) {
      __assert_fail("capacity == iov->iov_len",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c"
                    ,0x9f,"size_t obuf_dup(struct obuf *, const void *, size_t)");
    }
    if (0x1e < buf->pos + 1) {
      return size - fill;
    }
    buf->pos = buf->pos + 1;
    capacity = (size_t)(buf->iov + buf->pos);
    to_copy = buf->capacity[buf->pos];
  } while( true );
}

Assistant:

size_t
obuf_dup(struct obuf *buf, const void *data, size_t size)
{
	struct iovec *iov = &buf->iov[buf->pos];
	size_t capacity = buf->capacity[buf->pos];
	size_t to_copy = size;
	/**
	 * @pre buf->pos points at an array of allocated buffers.
	 * The array ends with a zero-initialized buffer.
	 */
	while (iov->iov_len + to_copy > capacity) {
		/*
		 * The data doesn't fit into this buffer.
		 * It could be because the buffer is not
		 * allocated, is partially or completely full.
		 * Copy as much as possible into already
		 * allocated buffers.
		 */
		if (iov->iov_len < capacity) {
			/*
			 * This buffer is allocated, but can't
			 * fit all the data. Copy as much data as
			 * possible.
			 */
			size_t fill = capacity - iov->iov_len;
			assert(fill < to_copy);
			memcpy((char *) iov->iov_base + iov->iov_len,
			       data, fill);

			iov->iov_len += fill;
			buf->used += fill;
			data = (char *) data + fill;
			to_copy -= fill;
			/*
			 * Check if the remainder can fit
			 * without allocations.
			 */
		} else if (capacity == 0) {
			/**
			 * Still some data to copy. We have to get
			 * a new buffer. Before we allocate
			 * a buffer for this position, ensure
			 * there is an unallocated buffer in the
			 * next one, since it works as an end
			 * marker for the loop above.
			 */
			if (obuf_alloc_pos(buf, to_copy) == NULL)
				return size - to_copy;
			break;
		}
		assert(capacity == iov->iov_len);
		if (buf->pos + 1 >= SMALL_OBUF_IOV_MAX)
			return size - to_copy;
		buf->pos++;
		iov = &buf->iov[buf->pos];
		capacity = buf->capacity[buf->pos];
	}
	memcpy((char *) iov->iov_base + iov->iov_len, data, to_copy);
	iov->iov_len += to_copy;
	buf->used += to_copy;
	assert(iov->iov_len <= buf->capacity[buf->pos]);
	return size;
}